

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

bool __thiscall cmCTestMemCheckHandler::InitializeMemoryChecking(cmCTestMemCheckHandler *this)

{
  string *psVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmCTest *pcVar4;
  size_type sVar5;
  pointer pbVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long *plVar11;
  ostream *poVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  size_type *psVar14;
  string extraOptions;
  string memoryTesterOptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string outputFile;
  string suppressionsOption;
  string testerName;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  pointer pbStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  string local_50;
  
  (this->MemoryTesterEnvironmentVariable)._M_string_length = 0;
  *(this->MemoryTesterEnvironmentVariable)._M_dataplus._M_p = '\0';
  (this->MemoryTester)._M_string_length = 0;
  *(this->MemoryTester)._M_dataplus._M_p = '\0';
  pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  paVar13 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckCommand","");
  cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_268);
  bVar7 = cmsys::SystemTools::FileExists((string *)local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar13) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &this->MemoryTester;
  if (bVar7) {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"MemoryCheckCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_268);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar13) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::GetFilenameName((string *)local_1c8,psVar1);
    lVar10 = std::__cxx11::string::find((char *)local_1c8,0x59bfe1,0);
    bVar7 = true;
    if (lVar10 == -1) {
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MemoryCheckType","");
      cmCTest::GetCTestConfiguration(&local_268,pcVar4,&local_50);
      iVar8 = std::__cxx11::string::compare((char *)&local_268);
      bVar7 = iVar8 == 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar13) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar7) {
      this->MemoryTesterStyle = 1;
    }
    else {
      lVar10 = std::__cxx11::string::find(local_1c8,0x59bffa,0);
      if (lVar10 == -1) {
        lVar10 = std::__cxx11::string::find(local_1c8,0x59c001,0);
        if (lVar10 == -1) {
          this->MemoryTesterStyle = 0;
        }
        else {
          this->MemoryTesterStyle = 3;
        }
      }
      else {
        this->MemoryTesterStyle = 2;
      }
    }
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_268._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"PurifyCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_268);
    bVar7 = cmsys::SystemTools::FileExists((string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar13) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"PurifyCommand","");
      cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_268);
      std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
      if (local_1c8 != (undefined1  [8])local_1b8) {
        operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar13) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      this->MemoryTesterStyle = 2;
    }
    else {
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_268._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ValgrindCommand","");
      cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_268);
      bVar7 = cmsys::SystemTools::FileExists((string *)local_1c8);
      if (local_1c8 != (undefined1  [8])local_1b8) {
        operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar13) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if (bVar7) {
        pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_268._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ValgrindCommand","");
        cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_268);
        std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
        if (local_1c8 != (undefined1  [8])local_1b8) {
          operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar13) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        this->MemoryTesterStyle = 1;
      }
      else {
        pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_268._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"BoundsCheckerCommand","");
        cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_268);
        bVar7 = cmsys::SystemTools::FileExists((string *)local_1c8);
        if (local_1c8 != (undefined1  [8])local_1b8) {
          operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar13) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_268._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,"BoundsCheckerCommand","");
          cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_268);
          std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
          if (local_1c8 != (undefined1  [8])local_1b8) {
            operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != paVar13) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          this->MemoryTesterStyle = 3;
        }
      }
    }
  }
  pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  paVar13 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
  iVar8 = std::__cxx11::string::compare(local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar13) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if (iVar8 == 0) {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_288._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar13) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 4;
    this->LogWithPID = true;
  }
  pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_288._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
  iVar8 = std::__cxx11::string::compare(local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar13) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if (iVar8 == 0) {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_288._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar13) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 5;
    this->LogWithPID = true;
  }
  pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_288._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
  iVar8 = std::__cxx11::string::compare(local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar13) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if (iVar8 == 0) {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_288._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar13) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 6;
    this->LogWithPID = true;
  }
  pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_288._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
  iVar8 = std::__cxx11::string::compare(local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar13) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if (iVar8 == 0) {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_288._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar13) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 7;
    this->LogWithPID = true;
  }
  pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_288._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"MemoryCheckType","");
  cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
  iVar8 = std::__cxx11::string::compare(local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar13) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if (iVar8 == 0) {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_288._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"CMakeCommand","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar13) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    this->MemoryTesterStyle = 8;
    this->LogWithPID = true;
  }
  if (this->MemoryTesterStyle == 0) {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_288._M_dataplus._M_p = (pointer)paVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"MemoryCheckType","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar13) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    iVar8 = std::__cxx11::string::compare(local_1c8);
    if (iVar8 == 0) {
      iVar8 = 2;
LAB_0018fbe7:
      this->MemoryTesterStyle = iVar8;
    }
    else {
      iVar8 = std::__cxx11::string::compare(local_1c8);
      if (iVar8 == 0) {
        iVar8 = 3;
        goto LAB_0018fbe7;
      }
      iVar8 = std::__cxx11::string::compare(local_1c8);
      if (iVar8 == 0) {
        iVar8 = 1;
        goto LAB_0018fbe7;
      }
    }
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->MemoryTester)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "Memory checker (MemoryCheckCommand) not set, or cannot find the specified program.",
               0x52);
    std::ios::widen((char)(ostringstream *)local_1c8 +
                    (char)*(undefined8 *)((long)local_1c8 + -0x18));
    std::ostream::put((char)local_1c8);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x1fb,local_288._M_dataplus._M_p,
                 (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar13) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    return false;
  }
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,"MemoryCheckCommandOptions","");
  cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_2a8);
  pbVar6 = pbStack_1c0;
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,(ulong)(local_2a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (pbVar6 == (pointer)0x0) {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"ValgrindCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_2a8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,
                      (ulong)(local_2a8.field_2._M_allocated_capacity + 1));
    }
    if (pbStack_1c0 != (pointer)0x0) {
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"ValgrindCommandOptions","");
      cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_2a8);
      goto LAB_0018fe7c;
    }
  }
  else {
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2a8,"MemoryCheckCommandOptions","");
    cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_2a8);
LAB_0018fe7c:
    std::__cxx11::string::operator=((string *)&local_288,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,
                      (ulong)(local_2a8.field_2._M_allocated_capacity + 1));
    }
  }
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2a8,&local_288);
  local_1c8 = (undefined1  [8])
              (this->MemoryTesterOptions).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_1c0 = (this->MemoryTesterOptions).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8[0]._0_8_ =
       (this->MemoryTesterOptions).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2a8._M_dataplus._M_p;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2a8._M_string_length;
  (this->MemoryTesterOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_2a8.field_2._M_allocated_capacity;
  local_2a8._M_dataplus._M_p = (pointer)0x0;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2a8);
  cmCTest::GetBinaryDir_abi_cxx11_
            (&local_2a8,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 == paVar13) {
    local_1b8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_1b8[0]._8_8_ = plVar11[3];
    local_1c8 = (undefined1  [8])local_1b8;
  }
  else {
    local_1b8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_1c8 = (undefined1  [8])*plVar11;
  }
  pbStack_1c0 = (pointer)plVar11[1];
  *plVar11 = (long)paVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  psVar1 = &this->MemoryTesterOutputFile;
  std::__cxx11::string::operator=((string *)psVar1,(string *)local_1c8);
  if (local_1c8 != (undefined1  [8])local_1b8) {
    operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (this->MemoryTesterStyle - 1U < 8) {
    this_00 = &this->MemoryTesterOptions;
    switch(this->MemoryTesterStyle) {
    case 1:
      if ((this->MemoryTesterOptions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->MemoryTesterOptions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [3])0x5dee4e);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[16]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [16])"--tool=memcheck");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [17])"--leak-check=yes");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[21]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [21])"--show-reachable=yes");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[17]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (char (*) [17])"--num-callers=50");
      }
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a8,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_2a8);
      pbVar6 = pbStack_1c0;
      if (local_1c8 != (undefined1  [8])local_1b8) {
        operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (pbVar6 != (pointer)0x0) {
        pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2a8,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration((string *)local_1c8,pcVar4,&local_2a8);
        bVar7 = cmsys::SystemTools::FileExists((string *)local_1c8);
        if (local_1c8 != (undefined1  [8])local_1b8) {
          operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c8,"Cannot find memory checker suppression file: ",0x2d);
          pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"MemoryCheckSuppressionFile","");
          cmCTest::GetCTestConfiguration(&local_2a8,pcVar4,&local_1e8);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1c8,local_2a8._M_dataplus._M_p,
                               local_2a8._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,
                            CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                     local_1e8.field_2._M_local_buf[0]) + 1);
          }
          pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,0x221,local_2a8._M_dataplus._M_p,false);
          goto LAB_00190beb;
        }
        pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration(&local_2a8,pcVar4,&local_1e8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,"--suppressions=",&local_2a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
        if (local_1c8 != (undefined1  [8])local_1b8) {
          operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                   local_1e8.field_2._M_local_buf[0]) + 1);
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     "--log-file=",psVar1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
      break;
    case 2:
      local_1c8 = (undefined1  [8])local_1b8;
      pbStack_1c0 = (pointer)0x0;
      local_1b8[0]._M_allocated_capacity = local_1b8[0]._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::_M_replace((ulong)local_1c8,0,(char *)0x0,0x59c184);
      std::__cxx11::string::_M_append
                (local_1c8,(ulong)(this->MemoryTesterOutputFile)._M_dataplus._M_p);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->MemoryTesterDynamicOptions,(value_type *)local_1c8);
      break;
    case 3:
      std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerXMLFile);
      cmCTest::GetBinaryDir_abi_cxx11_
                (&local_2a8,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_1c8 = (undefined1  [8])local_1b8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar13) {
        local_1b8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_1b8[0]._8_8_ = plVar11[3];
      }
      else {
        local_1b8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_1c8 = (undefined1  [8])*plVar11;
      }
      pbStack_1c0 = (pointer)plVar11[1];
      *plVar11 = (long)paVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&this->BoundsCheckerDPBDFile);
      this_01 = &this->MemoryTesterDynamicOptions;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 (char (*) [3])"/B");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
                 (char (*) [3])"/X");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_01,psVar1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [3])"/M");
      break;
    default:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,(char (*) [3])"-E");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->MemoryTesterDynamicOptions,(char (*) [4])"env");
      local_1c8 = (undefined1  [8])local_1b8;
      pbStack_1c0 = (pointer)0x0;
      local_1b8[0]._M_allocated_capacity = local_1b8[0]._M_allocated_capacity & 0xffffffffffffff00;
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_allocated_capacity =
           local_2a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      paVar13 = &local_248.field_2;
      local_248._M_dataplus._M_p = (pointer)paVar13;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,"MemoryCheckSanitizerOptions","");
      cmCTest::GetCTestConfiguration(&local_208,pcVar4,&local_248);
      sVar5 = local_208._M_string_length;
      paVar2 = &local_208.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar13) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (sVar5 != 0) {
        pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"MemoryCheckSanitizerOptions","");
        cmCTest::GetCTestConfiguration(&local_248,pcVar4,&local_228);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x5c216c);
        psVar14 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_208.field_2._M_allocated_capacity = *psVar14;
          local_208.field_2._8_8_ = plVar11[3];
          local_208._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar14;
          local_208._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_208._M_string_length = plVar11[1];
        *plVar11 = (long)psVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar13) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      local_248._M_dataplus._M_p = (pointer)paVar13;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_248,"MemoryCheckSuppressionFile","");
      cmCTest::GetCTestConfiguration(&local_208,pcVar4,&local_248);
      sVar5 = local_208._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar13) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (sVar5 != 0) {
        pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"MemoryCheckSuppressionFile","");
        cmCTest::GetCTestConfiguration(&local_248,pcVar4,&local_228);
        plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x59c1e1);
        psVar14 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_208.field_2._M_allocated_capacity = *psVar14;
          local_208.field_2._8_8_ = plVar11[3];
          local_208._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar14;
          local_208._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_208._M_string_length = plVar11[1];
        *plVar11 = (long)psVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar13) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
      }
      uVar9 = this->MemoryTesterStyle - 4;
      if (uVar9 < 5) {
        std::__cxx11::string::_M_replace
                  ((ulong)local_1c8,0,(char *)pbStack_1c0,
                   (ulong)(&DAT_0059bbb4 + *(int *)(&DAT_0059bbb4 + (ulong)uVar9 * 4)));
      }
      paVar3 = &local_228.field_2;
      local_228._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,local_1c8,
                 (char *)((long)local_1c8 + (long)&pbStack_1c0->_M_dataplus));
      std::__cxx11::string::append((char *)&local_228);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_228,
                                   (ulong)(this->MemoryTesterOutputFile)._M_dataplus._M_p);
      psVar14 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_248.field_2._M_allocated_capacity = *psVar14;
        local_248.field_2._8_8_ = plVar11[3];
        local_248._M_dataplus._M_p = (pointer)paVar13;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar14;
        local_248._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_248._M_string_length = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
      psVar14 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208.field_2._8_8_ = plVar11[3];
        local_208._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar14;
        local_208._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_208._M_string_length = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar13) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar3) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_228,&local_208,&local_1e8);
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_228,(ulong)local_2a8._M_dataplus._M_p);
      psVar14 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_248.field_2._M_allocated_capacity = *psVar14;
        local_248.field_2._8_8_ = plVar11[3];
        local_248._M_dataplus._M_p = (pointer)paVar13;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar14;
        local_248._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_248._M_string_length = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)&this->MemoryTesterEnvironmentVariable,(string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar13) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar3) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    bVar7 = true;
    InitializeResultsVectors(this);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Do not understand memory checker: ",0x22);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,(this->MemoryTester)._M_dataplus._M_p,
                         (this->MemoryTester)._M_string_length);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    pcVar4 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x289,local_2a8._M_dataplus._M_p,false);
LAB_00190beb:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    bVar7 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool cmCTestMemCheckHandler::InitializeMemoryChecking()
{
  this->MemoryTesterEnvironmentVariable.clear();
  this->MemoryTester.clear();
  // Setup the command
  if (cmSystemTools::FileExists(
        this->CTest->GetCTestConfiguration("MemoryCheckCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("MemoryCheckCommand");
    std::string testerName =
      cmSystemTools::GetFilenameName(this->MemoryTester);
    // determine the checker type
    if (testerName.find("valgrind") != std::string::npos ||
        this->CTest->GetCTestConfiguration("MemoryCheckType") == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    } else if (testerName.find("purify") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (testerName.find("BC") != std::string::npos) {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::UNKNOWN;
    }
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("PurifyCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("PurifyCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("ValgrindCommand"))) {
    this->MemoryTester = this->CTest->GetCTestConfiguration("ValgrindCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
  } else if (cmSystemTools::FileExists(
               this->CTest->GetCTestConfiguration("BoundsCheckerCommand"))) {
    this->MemoryTester =
      this->CTest->GetCTestConfiguration("BoundsCheckerCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "AddressSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::ADDRESS_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "LeakSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::LEAK_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "ThreadSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::THREAD_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "MemorySanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::MEMORY_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  if (this->CTest->GetCTestConfiguration("MemoryCheckType") ==
      "UndefinedBehaviorSanitizer") {
    this->MemoryTester = this->CTest->GetCTestConfiguration("CMakeCommand");
    this->MemoryTesterStyle = cmCTestMemCheckHandler::UB_SANITIZER;
    this->LogWithPID = true; // even if we give the log file the pid is added
  }
  // Check the MemoryCheckType
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::UNKNOWN) {
    std::string checkType =
      this->CTest->GetCTestConfiguration("MemoryCheckType");
    if (checkType == "Purify") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::PURIFY;
    } else if (checkType == "BoundsChecker") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::BOUNDS_CHECKER;
    } else if (checkType == "Valgrind") {
      this->MemoryTesterStyle = cmCTestMemCheckHandler::VALGRIND;
    }
  }
  if (this->MemoryTester.empty()) {
    cmCTestOptionalLog(this->CTest, WARNING,
                       "Memory checker (MemoryCheckCommand) "
                       "not set, or cannot find the specified program."
                         << std::endl,
                       this->Quiet);
    return false;
  }

  // Setup the options
  std::string memoryTesterOptions;
  if (!this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions")
         .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("MemoryCheckCommandOptions");
  } else if (!this->CTest->GetCTestConfiguration("ValgrindCommandOptions")
                .empty()) {
    memoryTesterOptions =
      this->CTest->GetCTestConfiguration("ValgrindCommandOptions");
  }
  this->MemoryTesterOptions =
    cmSystemTools::ParseArguments(memoryTesterOptions);

  this->MemoryTesterOutputFile =
    this->CTest->GetBinaryDir() + "/Testing/Temporary/MemoryChecker.??.log";

  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND: {
      if (this->MemoryTesterOptions.empty()) {
        this->MemoryTesterOptions.emplace_back("-q");
        this->MemoryTesterOptions.emplace_back("--tool=memcheck");
        this->MemoryTesterOptions.emplace_back("--leak-check=yes");
        this->MemoryTesterOptions.emplace_back("--show-reachable=yes");
        this->MemoryTesterOptions.emplace_back("--num-callers=50");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "Cannot find memory checker suppression file: "
                       << this->CTest->GetCTestConfiguration(
                            "MemoryCheckSuppressionFile")
                       << std::endl);
          return false;
        }
        this->MemoryTesterOptions.push_back(
          "--suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile"));
      }
      this->MemoryTesterDynamicOptions.push_back("--log-file=" +
                                                 this->MemoryTesterOutputFile);
      break;
    }
    case cmCTestMemCheckHandler::PURIFY: {
      std::string outputFile;
#ifdef _WIN32
      if (this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
            .size()) {
        if (!cmSystemTools::FileExists(this->CTest->GetCTestConfiguration(
              "MemoryCheckSuppressionFile"))) {
          cmCTestLog(
            this->CTest, ERROR_MESSAGE,
            "Cannot find memory checker suppression file: "
              << this->CTest
                   ->GetCTestConfiguration("MemoryCheckSuppressionFile")
                   .c_str()
              << std::endl);
          return false;
        }
        std::string filterFiles = "/FilterFiles=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
        this->MemoryTesterOptions.push_back(filterFiles);
      }
      outputFile = "/SAVETEXTDATA=";
#else
      outputFile = "-log-file=";
#endif
      outputFile += this->MemoryTesterOutputFile;
      this->MemoryTesterDynamicOptions.push_back(outputFile);
      break;
    }
    case cmCTestMemCheckHandler::BOUNDS_CHECKER: {
      this->BoundsCheckerXMLFile = this->MemoryTesterOutputFile;
      std::string dpbdFile = this->CTest->GetBinaryDir() +
        "/Testing/Temporary/MemoryChecker.??.DPbd";
      this->BoundsCheckerDPBDFile = dpbdFile;
      this->MemoryTesterDynamicOptions.emplace_back("/B");
      this->MemoryTesterDynamicOptions.push_back(std::move(dpbdFile));
      this->MemoryTesterDynamicOptions.emplace_back("/X");
      this->MemoryTesterDynamicOptions.push_back(this->MemoryTesterOutputFile);
      this->MemoryTesterOptions.emplace_back("/M");
      break;
    }
    // these are almost the same but the env var used is different
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
    case cmCTestMemCheckHandler::UB_SANITIZER: {
      // To pass arguments to ThreadSanitizer the environment variable
      // TSAN_OPTIONS is used. This is done with the cmake -E env command.
      // The MemoryTesterDynamicOptions is setup with the -E env
      // Then the MemoryTesterEnvironmentVariable gets the
      // TSAN_OPTIONS string with the log_path in it.
      this->MemoryTesterDynamicOptions.emplace_back("-E");
      this->MemoryTesterDynamicOptions.emplace_back("env");
      std::string envVar;
      std::string extraOptions;
      std::string suppressionsOption;
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions")
             .empty()) {
        extraOptions = ":" +
          this->CTest->GetCTestConfiguration("MemoryCheckSanitizerOptions");
      }
      if (!this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile")
             .empty()) {
        suppressionsOption = ":suppressions=" +
          this->CTest->GetCTestConfiguration("MemoryCheckSuppressionFile");
      }
      if (this->MemoryTesterStyle ==
          cmCTestMemCheckHandler::ADDRESS_SANITIZER) {
        envVar = "ASAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::LEAK_SANITIZER) {
        envVar = "LSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::THREAD_SANITIZER) {
        envVar = "TSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::MEMORY_SANITIZER) {
        envVar = "MSAN_OPTIONS";
      } else if (this->MemoryTesterStyle ==
                 cmCTestMemCheckHandler::UB_SANITIZER) {
        envVar = "UBSAN_OPTIONS";
      }
      // Quote log_path with single quotes; see
      // https://bugs.chromium.org/p/chromium/issues/detail?id=467936
      std::string outputFile =
        envVar + "=log_path='" + this->MemoryTesterOutputFile + "'";
      this->MemoryTesterEnvironmentVariable =
        outputFile + suppressionsOption + extraOptions;
      break;
    }
    default:
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Do not understand memory checker: " << this->MemoryTester
                                                      << std::endl);
      return false;
  }

  this->InitializeResultsVectors();
  // std::vector<std::string>::size_type cc;
  // for ( cc = 0; cmCTestMemCheckResultStrings[cc]; cc ++ )
  //   {
  //   this->MemoryTesterGlobalResults[cc] = 0;
  //   }
  return true;
}